

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool read_line(bufchain *input,strbuf *output,_Bool is_header)

{
  _Bool _Var1;
  uchar local_22;
  byte local_21;
  char c;
  strbuf *psStack_20;
  _Bool is_header_local;
  strbuf *output_local;
  bufchain *input_local;
  
  local_21 = is_header;
  psStack_20 = output;
  output_local = (strbuf *)input;
  do {
    while( true ) {
      _Var1 = bufchain_try_fetch((bufchain *)output_local,&local_22,1);
      if (!_Var1) {
        return false;
      }
      if ((((local_21 & 1) == 0) || (psStack_20->len == 0)) ||
         (psStack_20->s[psStack_20->len - 1] != '\n')) break;
      if ((local_22 != ' ') && (local_22 != '\t')) goto LAB_00169640;
    }
    BinarySink_put_byte(psStack_20->binarysink_,local_22);
    bufchain_consume((bufchain *)output_local,1);
  } while ((((local_21 & 1) != 0) || (psStack_20->len == 0)) ||
          (psStack_20->s[psStack_20->len - 1] != '\n'));
LAB_00169640:
  strbuf_chomp(psStack_20,'\n');
  strbuf_chomp(psStack_20,'\r');
  return true;
}

Assistant:

static bool read_line(bufchain *input, strbuf *output, bool is_header)
{
    char c;

    while (bufchain_try_fetch(input, &c, 1)) {
        if (is_header && output->len > 0 &&
            output->s[output->len - 1] == '\n') {
            /*
             * A newline terminates the header, provided we're sure it
             * is _not_ followed by a space or a tab.
             */
            if (c != ' ' && c != '\t')
                goto done;  /* we have a complete header line */
        } else {
            put_byte(output, c);
            bufchain_consume(input, 1);

            if (!is_header && output->len > 0 &&
                output->s[output->len - 1] == '\n') {
                /* If we're looking for just a line, not an HTTP
                 * header, then any newline terminates it. */
                goto done;
            }
        }
    }

    return false;

  done:
    strbuf_chomp(output, '\n');
    strbuf_chomp(output, '\r');
    return true;
}